

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags,
                     ImGuiWindow *docked_window)

{
  ImGuiViewportP **ppIVar1;
  ImGuiItemStatusFlags *pIVar2;
  short sVar3;
  ImGuiWindow_conflict *pIVar4;
  ImGuiTabItem *pIVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  uint3 uVar7;
  bool bVar8;
  ImGuiContext_conflict1 *pIVar9;
  char *pcVar10;
  bool *pbVar11;
  ulong uVar12;
  _Bool _Var13;
  ImU32 id;
  int iVar14;
  ImU32 col;
  uint uVar15;
  ImGuiID close_button_id;
  ulong uVar16;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  char *pcVar19;
  int iVar20;
  ImGuiDockNode *pIVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  ImGuiWindow *pIVar24;
  int iVar25;
  ImGuiCol idx;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  ImVec2 IVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  bool text_clipped;
  bool just_closed;
  float local_c8;
  uint local_c4;
  ImGuiContext_conflict1 *local_c0;
  ImRect bb;
  bool local_88;
  bool held;
  float local_68;
  undefined4 local_64;
  ImGuiWindow_conflict *local_60;
  bool hovered;
  float fStack_54;
  ImGuiWindow *local_50;
  char *local_48;
  ImVec2 local_40;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  local_c0 = GImGui;
  id = TabBarCalcTabID(tab_bar,label,docked_window);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return false;
  }
  if (((uint)flags >> 0x15 & 1) != 0 && p_open != (bool *)0x0) {
    __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1f0c,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  local_60 = pIVar4;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1f0d,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  uVar29 = (ulong)(flags | 0x100000);
  local_38 = p_open;
  if (((uint)flags >> 0x14 & 1) != 0) {
    uVar29 = (ulong)(uint)flags;
    local_38 = (bool *)0x0;
  }
  if (p_open != (bool *)0x0) {
    uVar29 = (ulong)(uint)flags;
  }
  IVar6 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  if (id == 0) {
LAB_002379da:
    pIVar23 = (ImGuiWindow *)0x0;
  }
  else {
    uVar16 = (ulong)(tab_bar->Tabs).Size;
    bVar30 = 0 < (long)uVar16;
    pIVar23 = docked_window;
    if (0 < (long)uVar16) {
      pIVar23 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar30 = true;
      if (*(ImU32 *)&pIVar23->Name != id) {
        pIVar22 = pIVar23;
        uVar12 = 1;
        do {
          uVar26 = uVar12;
          pIVar24 = (ImGuiWindow *)((long)pIVar23 + uVar16 * 0x30 + -0x30);
          if (uVar16 == uVar26) break;
          pIVar24 = (ImGuiWindow *)&pIVar22->Viewport;
          ppIVar1 = &pIVar22->Viewport;
          pIVar22 = pIVar24;
          uVar12 = uVar26 + 1;
        } while (*(ImU32 *)ppIVar1 != id);
        bVar30 = uVar26 < uVar16;
        pIVar23 = pIVar24;
      }
    }
    if (!bVar30) goto LAB_002379da;
  }
  local_c4 = (uint)uVar29;
  pIVar22 = pIVar23;
  if (pIVar23 == (ImGuiWindow *)0x0) {
    iVar28 = (tab_bar->Tabs).Size;
    iVar25 = (tab_bar->Tabs).Capacity;
    if (iVar28 == iVar25) {
      iVar28 = iVar28 + 1;
      if (iVar25 == 0) {
        iVar20 = 8;
      }
      else {
        iVar20 = iVar25 / 2 + iVar25;
      }
      if (iVar28 < iVar20) {
        iVar28 = iVar20;
      }
      if (iVar25 < iVar28) {
        pIVar17 = (ImGuiTabItem *)MemAlloc((long)iVar28 * 0x30);
        pIVar5 = (tab_bar->Tabs).Data;
        if (pIVar5 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar17,pIVar5,(long)(tab_bar->Tabs).Size * 0x30);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar17;
        (tab_bar->Tabs).Capacity = iVar28;
      }
    }
    pIVar17 = (tab_bar->Tabs).Data;
    iVar28 = (tab_bar->Tabs).Size;
    pIVar5 = pIVar17 + iVar28;
    pIVar5->ID = 0;
    pIVar5->Flags = 0;
    pIVar5->Window = (ImGuiWindow *)0x0;
    pIVar17[iVar28].LastFrameVisible = -1;
    pIVar17[iVar28].LastFrameSelected = -1;
    pIVar17[iVar28].ContentWidth = 0.0;
    pIVar17[iVar28].Offset = 0.0;
    pIVar17[iVar28].Width = 0.0;
    pIVar5 = pIVar17 + iVar28;
    pIVar5->NameOffset = -1;
    pIVar5->BeginOrder = -1;
    pIVar5->IndexDuringLayout = -1;
    *(undefined4 *)&pIVar17[iVar28].WantClose = 0;
    iVar28 = (tab_bar->Tabs).Size;
    uVar27 = iVar28 + 1;
    (tab_bar->Tabs).Size = uVar27;
    if (iVar28 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x70f,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar5 = (tab_bar->Tabs).Data;
    pIVar22 = (ImGuiWindow *)(pIVar5 + ((ulong)uVar27 - 1));
    *(ImU32 *)&pIVar22->Name = id;
    pIVar5[(ulong)uVar27 - 1].Width = IVar6.x;
    tab_bar->TabsAddedNew = true;
    uVar29 = (ulong)local_c4;
  }
  pIVar24 = (ImGuiWindow *)(tab_bar->Tabs).Data;
  local_48 = label;
  if ((pIVar22 < pIVar24) ||
     ((ImGuiWindow *)(&pIVar24->Name + (long)(tab_bar->Tabs).Size * 6) <= pIVar22)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x726,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar22 - (int)pIVar24) >> 4) * -0x5555;
  (pIVar22->WindowClass).ViewportFlagsOverrideClear = (ImGuiViewportFlags)IVar6.x;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  *(short *)&(pIVar22->WindowClass).DockNodeFlagsOverrideSet = sVar3;
  uVar27 = tab_bar->Flags;
  iVar28 = tab_bar->PrevFrameVisible;
  fVar40 = (float)local_c0->FrameCount;
  iVar25 = pIVar22->FlagsPreviousFrame;
  pIVar22->FlagsPreviousFrame = (ImGuiWindowFlags)fVar40;
  *(ImGuiTabItemFlags *)((long)&pIVar22->Name + 4) = (ImGuiTabItemFlags)uVar29;
  *(ImGuiWindow **)&pIVar22->ID = docked_window;
  if (docked_window == (ImGuiWindow *)0x0) {
    iVar20 = (tab_bar->TabsNames).Buf.Size;
    iVar14 = iVar20 + -1;
    if (iVar20 == 0) {
      iVar14 = 0;
    }
    (pIVar22->WindowClass).TabItemFlagsOverrideSet = iVar14;
    local_c8 = fVar40;
    sVar18 = strlen(label);
    uVar29 = (ulong)local_c4;
    ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar18 + 1);
    fVar40 = local_c8;
  }
  else {
    if ((uVar27 >> 0x14 & 1) == 0) {
      __assert_fail("tab_bar->Flags & ImGuiTabBarFlags_DockNode",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x1f34,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                   );
    }
    (pIVar22->WindowClass).TabItemFlagsOverrideSet = -1;
  }
  pIVar4 = local_60;
  iVar28 = iVar28 + 1;
  iVar25 = iVar25 + 1;
  uVar15 = (uint)uVar29;
  if (((iVar25 < (int)fVar40) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0))
  {
    if (iVar28 < (int)fVar40) {
      if ((uVar29 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) {
LAB_00237c0a:
        tab_bar->NextSelectedTabId = id;
      }
    }
    else if ((uVar15 >> 0x15 & 1) == 0) goto LAB_00237c0a;
  }
  if ((((uVar29 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar29 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_88 = true;
  }
  else {
    local_88 = false;
    if (((tab_bar->SelectedTabId == 0) && (docked_window == (ImGuiWindow *)0x0)) &&
       (iVar28 < (int)fVar40)) {
      if ((tab_bar->Tabs).Size == 1) {
        local_88 = (tab_bar->Flags & 2) == 0;
      }
      else {
        local_88 = false;
      }
    }
  }
  if ((iVar25 < (int)fVar40) && (pIVar23 == (ImGuiWindow *)0x0 || (int)fVar40 <= iVar28)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((uVar15 >> 0x15 & 1) == 0 & local_88);
  }
  if (tab_bar->SelectedTabId == id) {
    (pIVar22->WindowClass).ClassId = local_c0->FrameCount;
  }
  uVar33 = *(ImGuiTabItemFlags *)((long)&pIVar22->Name + 4);
  fVar34 = (float)(pIVar22->WindowClass).ViewportFlagsOverrideSet;
  fVar35 = (float)(pIVar22->WindowClass).ParentViewportId;
  if ((uVar33 & 0xc0) == 0) {
    fVar35 = (float)(int)(fVar35 - tab_bar->ScrollingAnim);
  }
  IVar36.x = fVar35 + (tab_bar->BarRect).Min.x;
  local_40 = (local_60->DC).CursorPos;
  IVar36.y = (tab_bar->BarRect).Min.y + 0.0;
  (local_60->DC).CursorPos = IVar36;
  fVar35 = (local_60->DC).CursorPos.x;
  fVar37 = (local_60->DC).CursorPos.y;
  bb.Min = (local_60->DC).CursorPos;
  bb.Max.x = fVar34 + fVar35;
  fVar34 = IVar6.y + fVar37;
  bb.Max.y = fVar34;
  if ((uVar33 & 0xc0) == 0) {
    uVar7 = (uint3)(uVar33 >> 8);
    local_64 = (undefined4)CONCAT71((uint7)uVar7,1);
    if (tab_bar->ScrollingRectMinX <= fVar35) {
      local_64 = CONCAT31(uVar7,tab_bar->ScrollingRectMaxX <= bb.Max.x &&
                                bb.Max.x != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    local_64 = 0;
  }
  local_c8 = fVar40;
  local_50 = pIVar22;
  if ((char)local_64 != '\0') {
    uVar33 = -(uint)(tab_bar->ScrollingRectMinX <= fVar35);
    fStack_54 = fVar37 + -1.0;
    _hovered = (float)(~uVar33 & (uint)tab_bar->ScrollingRectMinX | (uint)fVar35 & uVar33);
    _held = tab_bar->ScrollingRectMaxX;
    local_68 = fVar34;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  pIVar9 = local_c0;
  IVar6 = (pIVar4->DC).CursorMaxPos;
  fStack_54 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(local_c0->Style).FramePadding.y);
  (pIVar4->DC).CursorMaxPos = IVar6;
  _Var13 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!_Var13) {
    if ((char)local_64 != '\0') {
      PopClipRect();
    }
    (local_60->DC).CursorPos = local_40;
    return local_88;
  }
  uVar33 = ((uint)(uVar29 >> 0x11) & 0x10) + 0x1010;
  if (pIVar9->DragDropActive == true) {
    if ((pIVar9->DragDropPayload).DataFrameCount == -1) {
      bVar30 = false;
    }
    else {
      iVar28 = strcmp("_IMWINDOW",(pIVar9->DragDropPayload).DataType);
      bVar30 = iVar28 == 0;
    }
    if (!bVar30) {
      uVar33 = uVar33 | 0x200;
    }
  }
  bVar30 = ButtonBehavior(&bb,id,&hovered,&held,uVar33);
  if ((uVar15 >> 0x15 & 1) == 0 && bVar30) {
    tab_bar->NextSelectedTabId = id;
  }
  if ((((docked_window != (ImGuiWindow *)0x0) && (held != false)) && (local_c0->ActiveId == id)) &&
     (local_c0->ActiveIdIsJustActivated == true)) {
    local_c0->ActiveIdWindow = (ImGuiWindow_conflict *)docked_window;
  }
  if (local_c0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (docked_window == (ImGuiWindow *)0x0) {
    pIVar21 = (ImGuiDockNode *)0x0;
  }
  else {
    pIVar21 = docked_window->DockNode;
  }
  bVar31 = true;
  if (((pIVar21 != (ImGuiDockNode *)0x0) && (pIVar21->ParentNode == (ImGuiDockNode *)0x0)) &&
     ((pIVar21->MergedFlags & 0x400U) == 0)) {
    bVar31 = (pIVar21->Windows).Size != 1;
  }
  if (((held != true) || (bVar31)) || (_Var13 = IsMouseDragging(0,0.0), !_Var13)) {
    pIVar23 = local_50;
    if (((held == true) && ((int)local_c8 <= iVar25)) && (_Var13 = IsMouseDragging(0,-1.0), _Var13))
    {
      fVar40 = 0.0;
      if ((local_c0->DragDropActive == false) &&
         ((docked_window != (ImGuiWindow *)0x0 || ((tab_bar->Flags & 1U) != 0)))) {
        fVar34 = (local_c0->IO).MouseDelta.x;
        if (0.0 <= fVar34) {
LAB_00238036:
          if (0.0 < fVar34) {
            fVar34 = (local_c0->IO).MousePos.x;
            if (bb.Max.x < fVar34) {
              local_c8 = fVar34 - bb.Max.x;
              bVar8 = true;
              bVar31 = false;
              goto LAB_00238064;
            }
          }
          goto LAB_0023807b;
        }
        fVar35 = (local_c0->IO).MousePos.x;
        if (bb.Min.x <= fVar35) goto LAB_00238036;
        local_c8 = bb.Min.x - fVar35;
        bVar31 = true;
        bVar8 = false;
LAB_00238064:
        TabBarQueueReorderFromMousePos(tab_bar,(ImGuiTabItem *)pIVar23,(local_c0->IO).MousePos);
        fVar40 = local_c8;
      }
      else {
LAB_0023807b:
        bVar31 = false;
        bVar8 = false;
      }
      if ((docked_window != (ImGuiWindow *)0x0) && ((docked_window->Flags & 4) == 0)) {
        if (local_c0->DragDropActive == true) {
          bVar32 = (local_c0->DragDropPayload).SourceId == id;
        }
        else {
          bVar32 = false;
        }
        if (bVar32) {
LAB_00238182:
          if (!bVar32) goto LAB_0023820c;
        }
        else {
          fVar34 = local_c0->FontSize;
          fVar37 = (ABS((local_c0->IO).MouseDragMaxDistanceAbs[0].x) - (fVar34 + fVar34)) * 0.2;
          fVar35 = fVar34 * 4.0;
          if (fVar37 <= fVar34 * 4.0) {
            fVar35 = fVar37;
          }
          fVar39 = (local_c0->IO).MousePos.y;
          fVar38 = bb.Min.y - fVar39;
          fVar39 = fVar39 - bb.Max.y;
          uVar15 = -(uint)(fVar39 <= fVar38);
          bVar32 = fVar34 * 1.5 + (float)(~-(uint)(fVar37 < 0.0) & (uint)fVar35) <=
                   (float)(~uVar15 & (uint)fVar39 | (uint)fVar38 & uVar15);
          if ((fVar40 <= fVar34 * 2.2) ||
             (((!bVar31 ||
               (iVar28 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)pIVar23), iVar28 != 0)) &&
              ((!bVar8 ||
               (iVar28 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)pIVar23),
               iVar28 != (tab_bar->Tabs).Size + -1)))))) goto LAB_00238182;
        }
        pIVar9 = local_c0;
        DockContextQueueUndockWindow(local_c0,(ImGuiWindow_conflict *)docked_window);
        pIVar9->MovingWindow = (ImGuiWindow_conflict *)docked_window;
        SetActiveID(docked_window->MoveId,(ImGuiWindow_conflict *)docked_window);
        fVar40 = (pIVar9->MovingWindow->Pos).y;
        (pIVar9->ActiveIdClickOffset).x =
             (pIVar9->ActiveIdClickOffset).x - ((pIVar9->MovingWindow->Pos).x - bb.Min.x);
        (pIVar9->ActiveIdClickOffset).y = (pIVar9->ActiveIdClickOffset).y - (fVar40 - bb.Min.y);
        pIVar9->ActiveIdNoClearOnFocusLoss = true;
        SetActiveIdUsingNavAndKeys();
      }
    }
  }
  else {
    StartMouseMovingWindow((ImGuiWindow_conflict *)docked_window);
  }
LAB_0023820c:
  draw_list = local_60->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (local_88 == false) {
      idx = (uint)((uVar27 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar27 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  uVar27 = local_c4;
  TabItemBackground(draw_list,&bb,local_c4,col);
  RenderNavHighlight(&bb,id,1);
  _Var13 = IsItemHovered(0x20);
  if (_Var13) {
    _Var13 = IsMouseClicked(1,false);
    if (_Var13) {
      uVar15 = local_c4 >> 0x15 & 1;
      uVar27 = local_c4;
    }
    else {
      _Var13 = IsMouseReleased(1);
      uVar27 = local_c4;
      if (!_Var13) goto LAB_002382e4;
      uVar15 = local_c4 & 0x200000;
    }
    local_c4 = uVar27;
    if (uVar15 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_002382e4:
  pbVar11 = local_38;
  uVar15 = tab_bar->Flags;
  if (local_38 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar15 >> 1 & 4 | uVar27,tab_bar->FramePadding,local_48,id,
             close_button_id,local_88,&just_closed,&text_clipped);
  if ((pbVar11 != (bool *)0x0) && (just_closed != false)) {
    *pbVar11 = false;
    TabBarCloseTab(tab_bar,(ImGuiTabItem *)local_50);
  }
  pIVar23 = local_50;
  pIVar4 = local_60;
  if ((docked_window != (ImGuiWindow *)0x0) &&
     ((hovered != false || (local_c0->HoveredId == close_button_id)))) {
    pIVar2 = &(local_c0->LastItemData).StatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 0x80;
  }
  if ((char)local_64 != '\0') {
    PopClipRect();
  }
  (pIVar4->DC).CursorPos = local_40;
  if ((((text_clipped == true) && (local_c0->HoveredId == id)) && (held == false)) &&
     (((local_c0->TooltipSlowDelay <= local_c0->HoveredIdNotActiveTimer &&
        local_c0->HoveredIdNotActiveTimer != local_c0->TooltipSlowDelay &&
       (_Var13 = IsItemHovered(0), pcVar10 = local_48, _Var13)) &&
      (((tab_bar->Flags & 0x20) == 0 && (((ulong)pIVar23->Name & 0x1000000000) == 0)))))) {
    pcVar19 = FindRenderedTextEnd(local_48,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)pcVar10),pcVar10);
  }
  if (((local_c4 >> 0x15 & 1) != 0) &&
     (local_88 = bVar30, tab_bar->SelectedTabId == *(ImGuiID *)&pIVar23->Name)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x2006,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags, ImGuiWindow *)"
                 );
  }
  return local_88;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags, ImGuiWindow* docked_window)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label, docked_window);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;
    tab->Window = docked_window;

    // Append name with zero-terminator
    // (regular tabs are permitted in a DockNode tab bar, but window tabs not permitted in a non-DockNode tab bar)
    if (tab->Window != NULL)
    {
        IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_DockNode);
        tab->NameOffset = -1;
    }
    else
    {
        IM_ASSERT(tab->Window == NULL);
        tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
        tab_bar->TabsNames.append(label, label + strlen(label) + 1); // Append name _with_ the zero-terminator.
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing && docked_window == NULL)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive && !g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW)) // FIXME: May be an opt-in property of the payload to disable this
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Transfer active id window so the active id is not owned by the dock host (as StartMouseMovingWindow()
    // will only do it on the drag). This allows FocusWindow() to be more conservative in how it clears active id.
    if (held && docked_window && g.ActiveId == id && g.ActiveIdIsJustActivated)
        g.ActiveIdWindow = docked_window;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop a single floating window node moves it
    ImGuiDockNode* node = docked_window ? docked_window->DockNode : NULL;
    const bool single_floating_window_node = node && node->IsFloatingNode() && (node->Windows.Size == 1);
    if (held && single_floating_window_node && IsMouseDragging(0, 0.0f))
    {
        // Move
        StartMouseMovingWindow(docked_window);
    }
    else if (held && !tab_appearing && IsMouseDragging(0))
    {
        // Drag and drop: re-order tabs
        int drag_dir = 0;
        float drag_distance_from_edge_x = 0.0f;
        if (!g.DragDropActive && ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (docked_window != NULL)))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                drag_dir = -1;
                drag_distance_from_edge_x = bb.Min.x - g.IO.MousePos.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                drag_dir = +1;
                drag_distance_from_edge_x = g.IO.MousePos.x - bb.Max.x;
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }

        // Extract a Dockable window out of it's tab bar
        if (docked_window != NULL && !(docked_window->Flags & ImGuiWindowFlags_NoMove))
        {
            // We use a variable threshold to distinguish dragging tabs within a tab bar and extracting them out of the tab bar
            bool undocking_tab = (g.DragDropActive && g.DragDropPayload.SourceId == id);
            if (!undocking_tab) //&& (!g.IO.ConfigDockingWithShift || g.IO.KeyShift)
            {
                float threshold_base = g.FontSize;
                float threshold_x = (threshold_base * 2.2f);
                float threshold_y = (threshold_base * 1.5f) + ImClamp((ImFabs(g.IO.MouseDragMaxDistanceAbs[0].x) - threshold_base * 2.0f) * 0.20f, 0.0f, threshold_base * 4.0f);
                //GetForegroundDrawList()->AddRect(ImVec2(bb.Min.x - threshold_x, bb.Min.y - threshold_y), ImVec2(bb.Max.x + threshold_x, bb.Max.y + threshold_y), IM_COL32_WHITE); // [DEBUG]

                float distance_from_edge_y = ImMax(bb.Min.y - g.IO.MousePos.y, g.IO.MousePos.y - bb.Max.y);
                if (distance_from_edge_y >= threshold_y)
                    undocking_tab = true;
                if (drag_distance_from_edge_x > threshold_x)
                    if ((drag_dir < 0 && tab_bar->GetTabOrder(tab) == 0) || (drag_dir > 0 && tab_bar->GetTabOrder(tab) == tab_bar->Tabs.Size - 1))
                        undocking_tab = true;
            }

            if (undocking_tab)
            {
                // Undock
                // FIXME: refactor to share more code with e.g. StartMouseMovingWindow
                DockContextQueueUndockWindow(&g, docked_window);
                g.MovingWindow = docked_window;
                SetActiveID(g.MovingWindow->MoveId, g.MovingWindow);
                g.ActiveIdClickOffset -= g.MovingWindow->Pos - bb.Min;
                g.ActiveIdNoClearOnFocusLoss = true;
                SetActiveIdUsingNavAndKeys();
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Forward Hovered state so IsItemHovered() after Begin() can work (even though we are technically hovering our parent)
    // That state is copied to window->DockTabItemStatusFlags by our caller.
    if (docked_window && (hovered || g.HoveredId == close_button_id))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}